

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters.c
# Opt level: O2

void ihevc_inter_pred_luma_horz_w16out
               (UWORD8 *pu1_src,WORD16 *pi2_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  ulong uVar1;
  long lVar2;
  short sVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  
  uVar5 = 0;
  uVar1 = (ulong)(uint)wd;
  if (wd < 1) {
    uVar1 = uVar5;
  }
  uVar4 = (ulong)(uint)ht;
  if (ht < 1) {
    uVar4 = uVar5;
  }
  for (; (int)uVar5 != (int)uVar4; uVar5 = (ulong)((int)uVar5 + 1)) {
    lVar2 = -0x300000000;
    for (uVar8 = 0; uVar8 != uVar1; uVar8 = uVar8 + 1) {
      sVar3 = 0;
      lVar7 = lVar2;
      for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 1) {
        sVar3 = sVar3 + (ushort)pu1_src[lVar7 >> 0x20] * (short)pi1_coeff[lVar6];
        lVar7 = lVar7 + 0x100000000;
      }
      pi2_dst[uVar8] = sVar3;
      lVar2 = lVar2 + 0x100000000;
    }
    pu1_src = pu1_src + src_strd;
    pi2_dst = pi2_dst + dst_strd;
  }
  return;
}

Assistant:

void ihevc_inter_pred_luma_horz_w16out(UWORD8 *pu1_src,
                                       WORD16 *pi2_dst,
                                       WORD32 src_strd,
                                       WORD32 dst_strd,
                                       WORD8 *pi1_coeff,
                                       WORD32 ht,
                                       WORD32 wd)
{
    WORD32 row, col, i;
    WORD16 i2_tmp;

    for(row = 0; row < ht; row++)
    {
        for(col = 0; col < wd; col++)
        {
            i2_tmp = 0;
            for(i = 0; i < NTAPS_LUMA; i++)
                i2_tmp += pi1_coeff[i] * pu1_src[col + (i - 3)];

            pi2_dst[col] = i2_tmp;
        }

        pu1_src += src_strd;
        pi2_dst += dst_strd;
    }

}